

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86::forward_inplace(HardSwish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  
  auVar5 = _DAT_00538630;
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar8 = 0;
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar8;
  }
  do {
    if (uVar8 == uVar7) {
      return 0;
    }
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pfVar9 = (float *)(sVar4 * uVar8 * sVar3 + (long)pvVar2);
    lVar10 = 0;
    for (iVar12 = 0; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
      fVar1 = (this->super_HardSwish).beta;
      fVar13 = (this->super_HardSwish).alpha;
      auVar14._0_4_ = fVar13 * *pfVar9 + fVar1;
      auVar14._4_4_ = fVar13 * pfVar9[1] + fVar1;
      auVar14._8_4_ = fVar13 * pfVar9[2] + fVar1;
      auVar14._12_4_ = fVar13 * pfVar9[3] + fVar1;
      auVar14 = maxps(auVar14,ZEXT816(0));
      auVar14 = minps(auVar14,auVar5);
      *pfVar9 = auVar14._0_4_ * *pfVar9;
      pfVar9[1] = auVar14._4_4_ * pfVar9[1];
      pfVar9[2] = auVar14._8_4_ * pfVar9[2];
      pfVar9[3] = auVar14._12_4_ * pfVar9[3];
      pfVar9 = pfVar9 + 4;
      lVar10 = lVar10 + 4;
    }
    lVar11 = sVar4 * sVar3 * uVar8;
    for (; (int)lVar10 < iVar6; lVar10 = lVar10 + 1) {
      fVar1 = *(float *)((long)pvVar2 + lVar10 * 4 + lVar11);
      fVar13 = 0.0;
      if (fVar1 < (this->super_HardSwish).lower) {
LAB_0042259e:
        *(float *)((long)pvVar2 + lVar10 * 4 + lVar11) = fVar13;
      }
      else {
        pfVar9 = &(this->super_HardSwish).upper;
        if (fVar1 < *pfVar9 || fVar1 == *pfVar9) {
          fVar13 = ((this->super_HardSwish).alpha * fVar1 + (this->super_HardSwish).beta) * fVar1;
          goto LAB_0042259e;
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int HardSwish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}